

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.capnp.h
# Opt level: O2

void __thiscall
capnp::compiler::Declaration::AnnotationApplication::Value::Builder::adoptExpression
          (Builder *this,Orphan<capnp::compiler::Expression> *value)

{
  PointerBuilder local_18;
  
  *(undefined2 *)(this->_builder).data = 1;
  local_18.pointer = (this->_builder).pointers + 1;
  local_18.segment = (this->_builder).segment;
  local_18.capTable = (this->_builder).capTable;
  capnp::_::PointerBuilder::adopt(&local_18,&value->builder);
  return;
}

Assistant:

inline void Declaration::AnnotationApplication::Value::Builder::adoptExpression(
    ::capnp::Orphan< ::capnp::compiler::Expression>&& value) {
  _builder.setDataField<Declaration::AnnotationApplication::Value::Which>(
      ::capnp::bounded<0>() * ::capnp::ELEMENTS, Declaration::AnnotationApplication::Value::EXPRESSION);
  ::capnp::_::PointerHelpers< ::capnp::compiler::Expression>::adopt(_builder.getPointerField(
      ::capnp::bounded<1>() * ::capnp::POINTERS), kj::mv(value));
}